

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

void __thiscall CVmObjTable::save(CVmObjTable *this,CVmFile *fp)

{
  int iVar1;
  size_t sVar2;
  CVmObject *pCVar3;
  undefined4 extraout_var;
  undefined8 in_RSI;
  CVmObjTable *in_RDI;
  undefined1 uVar4;
  char buf [2];
  uint idx;
  ulong flags;
  long end_pos;
  long toc_cnt_pos;
  size_t save_cnt;
  size_t toc_cnt;
  vm_obj_id_t id;
  size_t j;
  size_t i;
  CVmObjPageEntry *entry;
  CVmObjPageEntry **pg;
  undefined4 in_stack_ffffffffffffff88;
  uint in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  CVmObjTable *in_stack_ffffffffffffffa0;
  CVmObjTable *in_stack_ffffffffffffffb0;
  long local_30;
  CVmFile *in_stack_ffffffffffffffd8;
  CVmMetaTable *in_stack_ffffffffffffffe0;
  CVmObjPageEntry *pCVar5;
  CVmObjPageEntry **local_18;
  
  gc_full(in_RDI);
  add_metadeps_for_instances(in_stack_ffffffffffffffb0);
  CVmMetaTable::write_to_file(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  gc_trace_imports(in_RDI);
  gc_trace_globals(in_stack_ffffffffffffffb0);
  gc_trace_work_queue(in_RDI,in_stack_ffffffffffffff8c);
  CVmFile::get_pos((CVmFile *)in_RDI);
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff8c);
  local_18 = in_RDI->pages_;
  for (sVar2 = in_RDI->pages_used_; sVar2 != 0; sVar2 = sVar2 - 1) {
    local_30 = 0x1000;
    pCVar5 = *local_18;
    for (; local_30 != 0; local_30 = local_30 + -1) {
      if ((((*(ushort *)&pCVar5->field_0x14 & 1) == 0) &&
          ((*(ushort *)&pCVar5->field_0x14 >> 2 & 3) == 2)) &&
         ((*(ushort *)&pCVar5->field_0x14 >> 1 & 1) == 0)) {
        in_stack_ffffffffffffffa0 =
             (CVmObjTable *)(ulong)((*(ushort *)&pCVar5->field_0x14 >> 7 & 1) != 0);
        CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff8c);
        CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff8c);
      }
      CVmObjPageEntry::is_saveable((CVmObjPageEntry *)in_stack_ffffffffffffffa0);
      pCVar5 = pCVar5 + 1;
    }
    local_18 = local_18 + 1;
  }
  CVmFile::get_pos((CVmFile *)in_RDI);
  CVmFile::set_pos((CVmFile *)in_RDI,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff8c);
  CVmFile::set_pos((CVmFile *)in_RDI,CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff8c);
  local_18 = in_RDI->pages_;
  for (sVar2 = in_RDI->pages_used_; sVar2 != 0; sVar2 = sVar2 - 1) {
    local_30 = 0x1000;
    pCVar5 = *local_18;
    for (; local_30 != 0; local_30 = local_30 + -1) {
      iVar1 = CVmObjPageEntry::is_saveable((CVmObjPageEntry *)in_stack_ffffffffffffffa0);
      if (iVar1 != 0) {
        CVmFile::write_uint4((CVmFile *)in_RDI,in_stack_ffffffffffffff8c);
        uVar4 = (*(ushort *)&pCVar5->field_0x14 >> 1 & 1) != 0;
        pCVar3 = CVmObjPageEntry::get_vm_obj(pCVar5);
        iVar1 = (**pCVar3->_vptr_CVmObject)();
        in_stack_ffffffffffffff9c =
             CVmMetaclass::get_reg_idx((CVmMetaclass *)CONCAT44(extraout_var,iVar1));
        iVar1 = CVmMetaTable::get_dependency_index(G_meta_table_X,in_stack_ffffffffffffff9c);
        CVmFile::write_bytes
                  ((CVmFile *)in_stack_ffffffffffffffa0,
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,
                                    CONCAT13((char)iVar1,CONCAT12(uVar4,in_stack_ffffffffffffff98)))
                   ,(size_t)in_RDI);
        pCVar3 = CVmObjPageEntry::get_vm_obj(pCVar5);
        (*pCVar3->_vptr_CVmObject[0x1d])(pCVar3,in_RSI);
      }
      gc_set_init_conditions
                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,(CVmObjPageEntry *)in_RDI);
      pCVar5 = pCVar5 + 1;
    }
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void CVmObjTable::save(VMG_ CVmFile *fp)
{
    CVmObjPageEntry **pg;
    CVmObjPageEntry *entry;
    size_t i;
    size_t j;
    vm_obj_id_t id;
    size_t toc_cnt;
    size_t save_cnt;
    long toc_cnt_pos;
    long end_pos;

    /*
     *   Before we save, perform a full GC pass.  This will ensure that we
     *   have removed all objects that are referenced only weakly, and
     *   cleaned up the weak references to them; this is important because
     *   we don't trace weak references for the purposes of calculating the
     *   set of objects that must be saved, and hence won't save any objects
     *   that are only weakly referenced, which would leave dangling
     *   references in the saved state if those weak references weren't
     *   cleaned up before the objects containing them are saved. 
     */
    gc_full(vmg0_);

    /* 
     *   Make sure that all of the metaclasses that we are actually using
     *   are in the metaclass dependency table.  We store the table in the
     *   file, because the table provides the mapping from file-local
     *   metaclass ID's to actual metaclasses; we must make sure that the
     *   table is complete (i.e., contains an entry for each metaclass of
     *   which there is an instance) before storing the table. 
     */
    add_metadeps_for_instances(vmg0_);

    /* save the metaclass table */
    G_meta_table->write_to_file(fp);

    /* 
     *   Figure out what objects we need to save.  We only need to save
     *   objects that are directly reachable from the root object set, from
     *   the imports, or from the globals.
     *   
     *   We don't need to save objects that are only accessible from the
     *   undo, because we don't save any undo information in the file.  We
     *   also don't need to save any objects that are reachable only from
     *   the stack, since the stack is inherently transient.
     *   
     *   Note that we don't need to trace from transient objects, since we
     *   won't be saving the transient objects and thus won't need to save
     *   anything referenced only from transient objects.
     *   
     *   So, we merely trace objects reachable from the imports, globals,
     *   and work queue.  At any time between GC passes, the work queue
     *   contains the complete list of root-set objects, hence we can simply
     *   trace from the current work queue.  
     */
    gc_trace_imports(vmg0_);
    gc_trace_globals(vmg0_);
    gc_trace_work_queue(vmg_ FALSE);

    /*
     *   Before we save the objects themselves, save a table of contents of
     *   the dynamically-allocated objects to be saved.  This table of
     *   contents will allow us to fix up references to objects on reloading
     *   the file with the new object numbers we assign them at that time.
     *   First, write a placeholder for the table of contents entry count.
     *   
     *   Note that we must store the table of contents in ascending order of
     *   object ID.  This happens naturally, since we scan the table in
     *   order of object ID.  
     */
    toc_cnt = 0;
    save_cnt = 0;
    toc_cnt_pos = fp->get_pos();
    fp->write_uint4(0);

    /* now scan the object pages and save the table of contents */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; -- j, ++entry, ++id)
        {
            /* 
             *   If the entry is currently reachable, and it was dynamically
             *   allocated (which means it's not in the root set), then add
             *   it to the table of contents.  Note that we won't
             *   necessarily be saving the object, because the object could
             *   be transient - but if so, then we still want the record of
             *   the transient object, so we'll know on reloading that the
             *   object is no longer available.  
             */
            if (!entry->free_
                && entry->reachable_ == VMOBJ_REACHABLE
                && !entry->in_root_set_)
            {
                ulong flags;
                
                /* set up the flags */
                flags = 0;
                if (entry->transient_)
                    flags |= VMOBJ_TOC_TRANSIENT;

                /* write the object ID and flags */
                fp->write_uint4(id);
                fp->write_uint4(flags);

                /* count it */
                ++toc_cnt;
            }

            /* if it's saveable, count it among the saveable objects */
            if (entry->is_saveable())
                ++save_cnt;
        }
    }

    /* go back and fix up the size prefix for the table of contents */
    end_pos = fp->get_pos();
    fp->set_pos(toc_cnt_pos);
    fp->write_uint4(toc_cnt);
    fp->set_pos(end_pos);

    /* write the saveable object count, which we calculated above */
    fp->write_uint4(save_cnt);

    /* scan all object pages, and save each reachable object */
    for (id = 0, i = pages_used_, pg = pages_ ; i > 0 ; ++pg, --i)
    {
        /* scan all objects on this page */
        for (j = VM_OBJ_PAGE_CNT, entry = *pg ; j > 0 ; -- j, ++entry, ++id)
        {
            /* if this object is saveable, save it */
            if (entry->is_saveable())
            {
                uint idx;
                char buf[2];
                
                /* write the object ID */
                fp->write_uint4(id);

                /* store the root-set flag */
                buf[0] = (entry->in_root_set_ != 0);

                /* store the dependency table index */
                idx = entry->get_vm_obj()->
                      get_metaclass_reg()->get_reg_idx();
                buf[1] = (char)G_meta_table->get_dependency_index(idx);

                /* write the data */
                fp->write_bytes(buf, 2);

                /* save the metaclass-specific state */
                entry->get_vm_obj()->save_to_file(vmg_ fp);
            }
            
            /* 
             *   restore this object to the appropriate conditions in
             *   preparation for the next GC pass, so that we leave things
             *   as we found them -- saving the VM's state thus has no
             *   effect on the VM's state 
             */
            gc_set_init_conditions(id, entry);
        }
    }
}